

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::get_append
          (CImg<unsigned_char> *__return_storage_ptr__,CImgList<unsigned_char> *this,char axis,
          float align)

{
  bool bVar1;
  char cVar2;
  CImg<unsigned_char> *pCVar3;
  uchar *puVar4;
  CImg<unsigned_char> *img_7;
  int l_7;
  CImg<unsigned_char> *img_6;
  CImg<unsigned_char> *pCStack_a8;
  int l_6;
  CImg<unsigned_char> *img_5;
  int l_5;
  CImg<unsigned_char> *img_4;
  CImg<unsigned_char> *pCStack_88;
  int l_4;
  CImg<unsigned_char> *img_3;
  int l_3;
  CImg<unsigned_char> *img_2;
  CImg<unsigned_char> *pCStack_68;
  int l_2;
  CImg<unsigned_char> *img_1;
  uchar local_55;
  int l_1;
  CImg<unsigned_char> *local_48;
  CImg<unsigned_char> *img;
  undefined1 local_35;
  int l;
  uint local_30;
  uint pos;
  uint dc;
  uint dz;
  uint dy;
  uint dx;
  float align_local;
  char axis_local;
  CImgList<unsigned_char> *this_local;
  CImg<unsigned_char> *res;
  
  dy = (uint)align;
  dx._3_1_ = axis;
  _align_local = this;
  this_local = (CImgList<unsigned_char> *)__return_storage_ptr__;
  bVar1 = is_empty(this);
  if (bVar1) {
    CImg<unsigned_char>::CImg(__return_storage_ptr__);
  }
  else if (this->_width == 1) {
    pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
    CImg<unsigned_char>::operator+(__return_storage_ptr__,pCVar3);
  }
  else {
    dz = 0;
    dc = 0;
    pos = 0;
    local_30 = 0;
    l = 0;
    local_35 = 0;
    CImg<unsigned_char>::CImg(__return_storage_ptr__);
    cVar2 = cimg::uncase(dx._3_1_);
    if (cVar2 == 'x') {
      for (img._4_4_ = 0; img._4_4_ < (int)this->_width; img._4_4_ = img._4_4_ + 1) {
        local_48 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
        local_48 = local_48 + img._4_4_;
        puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)local_48);
        if (puVar4 != (uchar *)0x0) {
          dz = local_48->_width + dz;
          dc = cimg::max<unsigned_int,unsigned_int>(&dc,&local_48->_height);
          pos = cimg::max<unsigned_int,unsigned_int>(&pos,&local_48->_depth);
          local_30 = cimg::max<unsigned_int,unsigned_int>(&local_30,&local_48->_spectrum);
        }
      }
      local_55 = '\0';
      CImg<unsigned_char>::assign(__return_storage_ptr__,dz,dc,pos,local_30,&local_55);
      puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)__return_storage_ptr__);
      if (puVar4 != (uchar *)0x0) {
        for (img_1._4_4_ = 0; img_1._4_4_ < (int)this->_width; img_1._4_4_ = img_1._4_4_ + 1) {
          pCStack_68 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
          pCStack_68 = pCStack_68 + img_1._4_4_;
          puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)pCStack_68);
          if (puVar4 != (uchar *)0x0) {
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,l,(int)((float)dy * (float)(dc - pCStack_68->_height))
                       ,(int)((float)dy * (float)(pos - pCStack_68->_depth)),
                       (int)((float)dy * (float)(local_30 - pCStack_68->_spectrum)),pCStack_68,1.0);
          }
          l = pCStack_68->_width + l;
        }
      }
    }
    else if (cVar2 == 'y') {
      for (img_2._4_4_ = 0; img_2._4_4_ < (int)this->_width; img_2._4_4_ = img_2._4_4_ + 1) {
        _l_3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
        _l_3 = _l_3 + img_2._4_4_;
        puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)_l_3);
        if (puVar4 != (uchar *)0x0) {
          dz = cimg::max<unsigned_int,unsigned_int>(&dz,&_l_3->_width);
          dc = _l_3->_height + dc;
          pos = cimg::max<unsigned_int,unsigned_int>(&pos,&_l_3->_depth);
          local_30 = cimg::max<unsigned_int,unsigned_int>(&local_30,&_l_3->_spectrum);
        }
      }
      img_3._7_1_ = 0;
      CImg<unsigned_char>::assign
                (__return_storage_ptr__,dz,dc,pos,local_30,(uchar *)((long)&img_3 + 7));
      puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)__return_storage_ptr__);
      if (puVar4 != (uchar *)0x0) {
        for (img_3._0_4_ = 0; (int)img_3 < (int)this->_width; img_3._0_4_ = (int)img_3 + 1) {
          pCStack_88 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
          pCStack_88 = pCStack_88 + (int)img_3;
          puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)pCStack_88);
          if (puVar4 != (uchar *)0x0) {
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,(int)((float)dy * (float)(dz - pCStack_88->_width)),l,
                       (int)((float)dy * (float)(pos - pCStack_88->_depth)),
                       (int)((float)dy * (float)(local_30 - pCStack_88->_spectrum)),pCStack_88,1.0);
          }
          l = pCStack_88->_height + l;
        }
      }
    }
    else if (cVar2 == 'z') {
      for (img_4._4_4_ = 0; img_4._4_4_ < (int)this->_width; img_4._4_4_ = img_4._4_4_ + 1) {
        _l_5 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
        _l_5 = _l_5 + img_4._4_4_;
        puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)_l_5);
        if (puVar4 != (uchar *)0x0) {
          dz = cimg::max<unsigned_int,unsigned_int>(&dz,&_l_5->_width);
          dc = cimg::max<unsigned_int,unsigned_int>(&dc,&_l_5->_height);
          pos = _l_5->_depth + pos;
          local_30 = cimg::max<unsigned_int,unsigned_int>(&local_30,&_l_5->_spectrum);
        }
      }
      img_5._7_1_ = 0;
      CImg<unsigned_char>::assign
                (__return_storage_ptr__,dz,dc,pos,local_30,(uchar *)((long)&img_5 + 7));
      puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)__return_storage_ptr__);
      if (puVar4 != (uchar *)0x0) {
        for (img_5._0_4_ = 0; (int)img_5 < (int)this->_width; img_5._0_4_ = (int)img_5 + 1) {
          pCStack_a8 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
          pCStack_a8 = pCStack_a8 + (int)img_5;
          puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)pCStack_a8);
          if (puVar4 != (uchar *)0x0) {
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,(int)((float)dy * (float)(dz - pCStack_a8->_width)),
                       (int)((float)dy * (float)(dc - pCStack_a8->_height)),l,
                       (int)((float)dy * (float)(local_30 - pCStack_a8->_spectrum)),pCStack_a8,1.0);
          }
          l = pCStack_a8->_depth + l;
        }
      }
    }
    else {
      for (img_6._4_4_ = 0; img_6._4_4_ < (int)this->_width; img_6._4_4_ = img_6._4_4_ + 1) {
        _l_7 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
        _l_7 = _l_7 + img_6._4_4_;
        puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)_l_7);
        if (puVar4 != (uchar *)0x0) {
          dz = cimg::max<unsigned_int,unsigned_int>(&dz,&_l_7->_width);
          dc = cimg::max<unsigned_int,unsigned_int>(&dc,&_l_7->_height);
          pos = cimg::max<unsigned_int,unsigned_int>(&pos,&_l_7->_depth);
          local_30 = _l_7->_spectrum + local_30;
        }
      }
      img_7._7_1_ = 0;
      CImg<unsigned_char>::assign
                (__return_storage_ptr__,dz,dc,pos,local_30,(uchar *)((long)&img_7 + 7));
      puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)__return_storage_ptr__);
      if (puVar4 != (uchar *)0x0) {
        for (img_7._0_4_ = 0; (int)img_7 < (int)this->_width; img_7._0_4_ = (int)img_7 + 1) {
          pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
          pCVar3 = pCVar3 + (int)img_7;
          puVar4 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)pCVar3);
          if (puVar4 != (uchar *)0x0) {
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,(int)((float)dy * (float)(dz - pCVar3->_width)),
                       (int)((float)dy * (float)(dc - pCVar3->_height)),
                       (int)((float)dy * (float)(pos - pCVar3->_depth)),l,pCVar3,1.0);
          }
          l = pCVar3->_spectrum + l;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::uncase(axis)) {
      case 'x' : { // Along the X-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx+=img._width;
            dy = cimg::max(dy,img._height);
            dz = cimg::max(dz,img._depth);
            dc = cimg::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image(pos,
                                    (int)(align*(dy - img._height)),
                                    (int)(align*(dz - img._depth)),
                                    (int)(align*(dc - img._spectrum)),
                                    img);
            pos+=img._width;
          }
      } break;
      case 'y' : { // Along the Y-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = cimg::max(dx,img._width);
            dy+=img._height;
            dz = cimg::max(dz,img._depth);
            dc = cimg::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image((int)(align*(dx - img._width)),
                                    pos,
                                    (int)(align*(dz - img._depth)),
                                    (int)(align*(dc - img._spectrum)),
                                    img);
            pos+=img._height;
          }
      } break;
      case 'z' : { // Along the Z-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = cimg::max(dx,img._width);
            dy = cimg::max(dy,img._height);
            dz+=img._depth;
            dc = cimg::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image((int)(align*(dx - img._width)),
                                    (int)(align*(dy - img._height)),
                                    pos,
                                    (int)(align*(dc - img._spectrum)),
                                    img);
            pos+=img._depth;
          }
      } break;
      default : { // Along the C-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = cimg::max(dx,img._width);
            dy = cimg::max(dy,img._height);
            dz = cimg::max(dz,img._depth);
            dc+=img._spectrum;
          }
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) res.draw_image((int)(align*(dx - img._width)),
                                    (int)(align*(dy - img._height)),
                                    (int)(align*(dz - img._depth)),
                                    pos,
                                    img);
            pos+=img._spectrum;
          }
      }
      }
      return res;
    }